

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int btreeComputeFreeSpace(MemPage *pPage)

{
  byte bVar1;
  uint uVar2;
  u8 *puVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  u32 size;
  u32 next;
  int iCellLast;
  int iCellFirst;
  int top;
  int nFree;
  int usableSize;
  u8 *data;
  u8 hdr;
  int pc;
  MemPage *pPage_local;
  
  uVar2 = pPage->pBt->usableSize;
  bVar1 = pPage->hdrOffset;
  puVar3 = pPage->aData;
  uVar4 = (CONCAT11(puVar3[(int)(bVar1 + 5)],puVar3[(long)(int)(bVar1 + 5) + 1]) - 1 & 0xffff) + 1;
  iVar5 = bVar1 + 8 + (uint)pPage->childPtrSize + (uint)pPage->nCell * 2;
  uVar6 = (uint)CONCAT11(puVar3[(int)(bVar1 + 1)],puVar3[(long)(int)(bVar1 + 1) + 1]);
  iCellFirst = puVar3[(int)(bVar1 + 7)] + uVar4;
  if (uVar6 != 0) {
    if (uVar6 < uVar4) {
      iVar5 = sqlite3CorruptError(0x10cfe);
      return iVar5;
    }
    do {
      data._4_4_ = uVar6;
      if ((int)(uVar2 - 4) < (int)data._4_4_) {
        iVar5 = sqlite3CorruptError(0x10d03);
        return iVar5;
      }
      uVar6 = (uint)CONCAT11(puVar3[(int)data._4_4_],puVar3[(long)(int)data._4_4_ + 1]);
      uVar4 = (uint)CONCAT11(puVar3[(int)(data._4_4_ + 2)],puVar3[(long)(int)(data._4_4_ + 2) + 1]);
      iCellFirst = iCellFirst + uVar4;
    } while (data._4_4_ + uVar4 + 3 < uVar6);
    if (uVar6 != 0) {
      iVar5 = sqlite3CorruptError(0x10d0d);
      return iVar5;
    }
    if (uVar2 < data._4_4_ + uVar4) {
      iVar5 = sqlite3CorruptError(0x10d11);
      return iVar5;
    }
  }
  if (((int)uVar2 < iCellFirst) || (iCellFirst < iVar5)) {
    pPage_local._4_4_ = sqlite3CorruptError(0x10d1d);
  }
  else {
    pPage->nFree = iCellFirst - iVar5 & 0xffff;
    pPage_local._4_4_ = 0;
  }
  return pPage_local._4_4_;
}

Assistant:

static int btreeComputeFreeSpace(MemPage *pPage){
  int pc;            /* Address of a freeblock within pPage->aData[] */
  u8 hdr;            /* Offset to beginning of page header */
  u8 *data;          /* Equal to pPage->aData */
  int usableSize;    /* Amount of usable space on each page */
  int nFree;         /* Number of unused bytes on the page */
  int top;           /* First byte of the cell content area */
  int iCellFirst;    /* First allowable cell or freeblock offset */
  int iCellLast;     /* Last possible cell or freeblock offset */

  assert( pPage->pBt!=0 );
  assert( pPage->pBt->db!=0 );
  assert( sqlite3_mutex_held(pPage->pBt->mutex) );
  assert( pPage->pgno==sqlite3PagerPagenumber(pPage->pDbPage) );
  assert( pPage == sqlite3PagerGetExtra(pPage->pDbPage) );
  assert( pPage->aData == sqlite3PagerGetData(pPage->pDbPage) );
  assert( pPage->isInit==1 );
  assert( pPage->nFree<0 );

  usableSize = pPage->pBt->usableSize;
  hdr = pPage->hdrOffset;
  data = pPage->aData;
  /* EVIDENCE-OF: R-58015-48175 The two-byte integer at offset 5 designates
  ** the start of the cell content area. A zero value for this integer is
  ** interpreted as 65536. */
  top = get2byteNotZero(&data[hdr+5]);
  iCellFirst = hdr + 8 + pPage->childPtrSize + 2*pPage->nCell;
  iCellLast = usableSize - 4;

  /* Compute the total free space on the page
  ** EVIDENCE-OF: R-23588-34450 The two-byte integer at offset 1 gives the
  ** start of the first freeblock on the page, or is zero if there are no
  ** freeblocks. */
  pc = get2byte(&data[hdr+1]);
  nFree = data[hdr+7] + top;  /* Init nFree to non-freeblock free space */
  if( pc>0 ){
    u32 next, size;
    if( pc<top ){
      /* EVIDENCE-OF: R-55530-52930 In a well-formed b-tree page, there will
      ** always be at least one cell before the first freeblock.
      */
      return SQLITE_CORRUPT_PAGE(pPage);
    }
    while( 1 ){
      if( pc>iCellLast ){
        /* Freeblock off the end of the page */
        return SQLITE_CORRUPT_PAGE(pPage);
      }
      next = get2byte(&data[pc]);
      size = get2byte(&data[pc+2]);
      nFree = nFree + size;
      if( next<=pc+size+3 ) break;
      pc = next;
    }
    if( next>0 ){
      /* Freeblock not in ascending order */
      return SQLITE_CORRUPT_PAGE(pPage);
    }
    if( pc+size>(unsigned int)usableSize ){
      /* Last freeblock extends past page end */
      return SQLITE_CORRUPT_PAGE(pPage);
    }
  }

  /* At this point, nFree contains the sum of the offset to the start
  ** of the cell-content area plus the number of free bytes within
  ** the cell-content area. If this is greater than the usable-size
  ** of the page, then the page must be corrupted. This check also
  ** serves to verify that the offset to the start of the cell-content
  ** area, according to the page header, lies within the page.
  */
  if( nFree>usableSize || nFree<iCellFirst ){
    return SQLITE_CORRUPT_PAGE(pPage);
  }
  pPage->nFree = (u16)(nFree - iCellFirst);
  return SQLITE_OK;
}